

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O2

int x25519_ge_frombytes_vartime(ge_p3 *h,uint8_t *s)

{
  fe *h_00;
  uint uVar1;
  int iVar2;
  bool bVar3;
  fe t1;
  fe_loose check;
  fe local_f8;
  fe vxx;
  fe u;
  fe w;
  fe_loose v;
  
  h_00 = &h->Y;
  fe_frombytes(h_00,s);
  (h->Z).v[3] = 0;
  (h->Z).v[4] = 0;
  (h->Z).v[1] = 0;
  (h->Z).v[2] = 0;
  (h->Z).v[0] = 1;
  fe_sq_tt(&w,h_00);
  fe_mul_impl(vxx.v,w.v,d.v);
  fe_sub(&v,&w,&h->Z);
  fe_carry(&u,&v);
  fe_add(&v,&vxx,&h->Z);
  fe_mul_impl(w.v,u.v,v.v);
  fe_sq_tt((fe *)&check,&w);
  fe_sq_tt(&t1,(fe *)&check);
  fe_sq_tt(&t1,&t1);
  fe_mul_impl(t1.v,w.v,t1.v);
  fe_mul_impl((fe_limb_t *)&check,(fe_limb_t *)&check,t1.v);
  fe_sq_tt((fe *)&check,(fe *)&check);
  fe_mul_impl((fe_limb_t *)&check,t1.v,(fe_limb_t *)&check);
  fe_sq_tt(&t1,(fe *)&check);
  iVar2 = 4;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    fe_sq_tt(&t1,&t1);
  }
  fe_mul_impl((fe_limb_t *)&check,t1.v,(fe_limb_t *)&check);
  fe_sq_tt(&t1,(fe *)&check);
  iVar2 = 9;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    fe_sq_tt(&t1,&t1);
  }
  fe_mul_impl(t1.v,t1.v,check.v);
  fe_sq_tt(&local_f8,&t1);
  iVar2 = 0x13;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    fe_sq_tt(&local_f8,&local_f8);
  }
  fe_mul_impl(t1.v,local_f8.v,t1.v);
  fe_sq_tt(&t1,&t1);
  iVar2 = 9;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    fe_sq_tt(&t1,&t1);
  }
  fe_mul_impl((fe_limb_t *)&check,t1.v,(fe_limb_t *)&check);
  fe_sq_tt(&t1,(fe *)&check);
  iVar2 = 0x31;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    fe_sq_tt(&t1,&t1);
  }
  fe_mul_impl(t1.v,t1.v,check.v);
  fe_sq_tt(&local_f8,&t1);
  iVar2 = 99;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    fe_sq_tt(&local_f8,&local_f8);
  }
  fe_mul_impl(t1.v,local_f8.v,t1.v);
  fe_sq_tt(&t1,&t1);
  iVar2 = 0x31;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    fe_sq_tt(&t1,&t1);
  }
  fe_mul_impl((fe_limb_t *)&check,t1.v,(fe_limb_t *)&check);
  fe_sq_tt((fe *)&check,(fe *)&check);
  fe_sq_tt((fe *)&check,(fe *)&check);
  fe_mul_impl((fe_limb_t *)h,(fe_limb_t *)&check,w.v);
  fe_mul_impl((fe_limb_t *)h,(fe_limb_t *)h,u.v);
  fe_sq_tt(&vxx,&h->X);
  fe_mul_impl(vxx.v,vxx.v,v.v);
  fe_sub(&check,&vxx,&u);
  iVar2 = fe_isnonzero(&check);
  if (iVar2 != 0) {
    fe_add(&check,&vxx,&u);
    iVar2 = fe_isnonzero(&check);
    if (iVar2 != 0) {
      return 0;
    }
    fe_mul_impl((fe_limb_t *)h,(fe_limb_t *)h,sqrtm1.v);
  }
  uVar1 = fe_isnegative(&h->X);
  if (uVar1 != s[0x1f] >> 7) {
    fe_neg((fe_loose *)&t1,&h->X);
    fe_carry(&h->X,(fe_loose *)&t1);
  }
  fe_mul_impl((h->T).v,(fe_limb_t *)h,h_00->v);
  return 1;
}

Assistant:

int x25519_ge_frombytes_vartime(ge_p3 *h, const uint8_t s[32]) {
  fe u;
  fe_loose v;
  fe w;
  fe vxx;
  fe_loose check;

  fe_frombytes(&h->Y, s);
  fe_1(&h->Z);
  fe_sq_tt(&w, &h->Y);
  fe_mul_ttt(&vxx, &w, &d);
  fe_sub(&v, &w, &h->Z);  // u = y^2-1
  fe_carry(&u, &v);
  fe_add(&v, &vxx, &h->Z);  // v = dy^2+1

  fe_mul_ttl(&w, &u, &v);        // w = u*v
  fe_pow22523(&h->X, &w);        // x = w^((q-5)/8)
  fe_mul_ttt(&h->X, &h->X, &u);  // x = u*w^((q-5)/8)

  fe_sq_tt(&vxx, &h->X);
  fe_mul_ttl(&vxx, &vxx, &v);
  fe_sub(&check, &vxx, &u);
  if (fe_isnonzero(&check)) {
    fe_add(&check, &vxx, &u);
    if (fe_isnonzero(&check)) {
      return 0;
    }
    fe_mul_ttt(&h->X, &h->X, &sqrtm1);
  }

  if (fe_isnegative(&h->X) != (s[31] >> 7)) {
    fe_loose t;
    fe_neg(&t, &h->X);
    fe_carry(&h->X, &t);
  }

  fe_mul_ttt(&h->T, &h->X, &h->Y);
  return 1;
}